

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

void __thiscall
ThreadedReplayer::run_creation_work_item_compute_iteration
          (ThreadedReplayer *this,PipelineWorkItem *work_item,VkPipelineCache cache,bool primary)

{
  atomic<unsigned_int> *paVar1;
  VkPipelineCreationFeedbackCreateInfoEXT *pVVar2;
  ResourceTag RVar3;
  uint uVar4;
  VkGraphicsPipelineCreateInfo *pVVar5;
  SharedControlBlock *pSVar6;
  VkResult VVar7;
  long lVar8;
  long lVar9;
  VkShaderStageFlagBits *pVVar10;
  ulong uVar11;
  PipelineFeedback feedback;
  undefined4 auStack_108 [2];
  PipelineFeedback local_100;
  
  if (*(work_item->hash_map_entry).pipeline != (VkPipeline)0x0) {
    (*vkDestroyPipeline)
              (((this->device)._M_t.
                super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
               *(work_item->hash_map_entry).pipeline,(VkAllocationCallbacks *)0x0);
  }
  *(work_item->hash_map_entry).pipeline = (VkPipeline)0x0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  lVar9 = 8;
  do {
    *(undefined4 *)((long)auStack_108 + lVar9) = 0;
    *(undefined8 *)((long)&local_100.feedbacks[0].flags + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x88);
  local_100.feedback.pPipelineCreationFeedback = &local_100.primary_feedback;
  local_100.primary_feedback.flags = 0;
  local_100.primary_feedback.duration = 0;
  local_100.feedback.sType = VK_STRUCTURE_TYPE_PIPELINE_CREATION_FEEDBACK_CREATE_INFO;
  local_100.feedback.pNext = (void *)0x0;
  local_100.feedback.pipelineStageCreationFeedbackCount = 0;
  local_100.stages[0] = 0;
  local_100.stages[1] = 0;
  local_100.stages[2] = 0;
  local_100.stages[3] = 0;
  local_100.stages[4] = 0;
  local_100.stages[5] = 0;
  local_100.stages[6] = 0;
  local_100.stages[7] = 0;
  local_100.feedback.pPipelineStageCreationFeedbacks = local_100.feedbacks;
  if (((this->disk_pipeline_cache != (VkPipelineCache)0x0) || ((this->opts).pipeline_stats == true))
     && (((this->device)._M_t.
          super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
          ._M_t.
          super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
          .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
         supports_pipeline_feedback == true)) {
    pVVar2 = &local_100.feedback;
    RVar3 = work_item->tag;
    if (RVar3 == RESOURCE_RAYTRACING_PIPELINE) {
      local_100.feedback.pipelineStageCreationFeedbackCount = 0;
      local_100.feedback.pNext = ((work_item->create_info).graphics_create_info)->pNext;
      ((work_item->create_info).graphics_create_info)->pNext = pVVar2;
    }
    else if (RVar3 == RESOURCE_COMPUTE_PIPELINE) {
      local_100.feedback.pipelineStageCreationFeedbackCount = 1;
      local_100.feedback.pNext = ((work_item->create_info).graphics_create_info)->pNext;
      ((work_item->create_info).graphics_create_info)->pNext = pVVar2;
      local_100.stages[0] = VK_SHADER_STAGE_COMPUTE_BIT;
      local_100.stages[1] = 0;
    }
    else if (RVar3 == RESOURCE_GRAPHICS_PIPELINE) {
      pVVar5 = (work_item->create_info).graphics_create_info;
      uVar4 = pVVar5->stageCount;
      local_100.feedback.pipelineStageCreationFeedbackCount = 8;
      if (uVar4 < 8) {
        local_100.feedback.pipelineStageCreationFeedbackCount = uVar4;
      }
      local_100.feedback.pNext = pVVar5->pNext;
      pVVar5->pNext = pVVar2;
      if (uVar4 != 0) {
        pVVar10 = &pVVar5->pStages->stage;
        uVar11 = 0;
        do {
          local_100.stages[uVar11] = *pVVar10;
          uVar11 = uVar11 + 1;
          pVVar10 = pVVar10 + 0xc;
        } while (local_100.feedback.pipelineStageCreationFeedbackCount != uVar11);
      }
    }
  }
  VVar7 = (*vkCreateComputePipelines)
                    (((this->device)._M_t.
                      super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                      .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device
                     ,cache,1,(VkComputePipelineCreateInfo *)
                              (work_item->create_info).graphics_create_info,
                     (VkAllocationCallbacks *)0x0,(work_item->output).pipeline);
  if (VVar7 == VK_SUCCESS) {
    lVar9 = std::chrono::_V2::steady_clock::now();
    LOCK();
    (this->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i =
         (this->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i + (lVar9 - lVar8);
    UNLOCK();
    LOCK();
    (this->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i =
         (this->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    if (primary) {
      if ((this->opts).pipeline_stats == true) {
        get_pipeline_stats(this,work_item->tag,work_item->hash,*(work_item->output).pipeline,
                           &local_100,lVar9 - lVar8);
      }
      pSVar6 = (this->opts).control_block;
      if (pSVar6 != (SharedControlBlock *)0x0) {
        LOCK();
        paVar1 = &pSVar6->successful_compute;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      check_pipeline_cache_feedback(this,&local_100);
    }
    complete_work_item(this,work_item);
  }
  else {
    run_creation_work_item_compute_iteration((ThreadedReplayer *)work_item);
  }
  return;
}

Assistant:

void run_creation_work_item_compute_iteration(const PipelineWorkItem &work_item, VkPipelineCache cache, bool primary)
	{
		reset_work_item(work_item);

		auto start_time = chrono::steady_clock::now();

#ifdef SIMULATE_UNSTABLE_DRIVER
		spurious_crash();
#endif
		PipelineFeedback feedback;
		if ((disk_pipeline_cache || opts.pipeline_stats) && device->pipeline_feedback_enabled())
			feedback.setup_pnext(work_item);

		if (vkCreateComputePipelines(device->get_device(), cache, 1,
									 work_item.create_info.compute_create_info,
									 nullptr, work_item.output.pipeline) == VK_SUCCESS)
		{
			auto end_time = chrono::steady_clock::now();
			auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();

			compute_pipeline_ns.fetch_add(duration_ns, std::memory_order_relaxed);
			compute_pipeline_count.fetch_add(1, std::memory_order_relaxed);

			if (primary)
			{
				if (opts.pipeline_stats)
					get_pipeline_stats(work_item.tag, work_item.hash, *work_item.output.pipeline, feedback, duration_ns);
				if (opts.control_block)
					opts.control_block->successful_compute.fetch_add(1, std::memory_order_relaxed);
				check_pipeline_cache_feedback(feedback);
			}

			complete_work_item(work_item);
		}
		else
		{
			LOGE("Failed to create compute pipeline for hash 0x%016" PRIx64 ".\n", work_item.hash);
		}
	}